

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O1

void __thiscall Sudoku::restart(Sudoku *this)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  ulong uVar5;
  Sudoku temp;
  sudoku_policko local_1d4 [81];
  uint local_90 [9];
  uint auStack_6c [9];
  uint auStack_48 [10];
  int local_20;
  
  uVar5 = 0;
  memset(local_1d4,0,0x1bc);
  do {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    if (((uint)(this->s).pole[uVar5] & 0x10) != 0) {
      local_1d4[uVar5] = (this->s).pole[uVar5];
      uVar4 = 1 << (*(byte *)((this->s).pole + uVar5) & 0xf);
      puVar1 = (uint *)((long)auStack_6c +
                       (ulong)((uint)((uVar5 & 0xffffffff) * 0x38e38e39 >> 0x20) & 0xfffffffe) * 2);
      *puVar1 = *puVar1 | uVar4;
      puVar1 = (uint *)((long)local_90 +
                       uVar5 * 4 +
                       (SUB168(auVar2 * ZEXT816(0xe38e38e38e38e38f),8) >> 1 & 0xfffffffffffffffc) *
                       -9);
      *puVar1 = *puVar1 | uVar4;
      iVar3 = (int)((uVar5 & 0xffffffff) * 0x2f684bdb >> 0x20);
      auStack_48
      [((ulong)(uint)((int)((uVar5 & 0xffffffff) / 9) * -9 + (int)uVar5) / 3) * 3 +
       (ulong)(((uint)((int)uVar5 - iVar3) >> 1) + iVar3 >> 4)] =
           auStack_48
           [((ulong)(uint)((int)((uVar5 & 0xffffffff) / 9) * -9 + (int)uVar5) / 3) * 3 +
            (ulong)(((uint)((int)uVar5 - iVar3) >> 1) + iVar3 >> 4)] | uVar4;
      local_20 = local_20 + 1;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x51);
  memcpy(this,local_1d4,0x1bc);
  return;
}

Assistant:

void Sudoku::restart( void )
{
  Sudoku temp(-1); // operace probiha kopirovanim do docasneho sudoku
  int x,y;
  for(int i = 0; i< 81; i++)// projdeme vse
  {
    if(s.pole[i].pevne)// narazime-li na pevne cislo
    {
      // prekopirujeme jeho stav
      temp.s.pole[i] = s.pole[i];
      x = i % 9;
      y = i / 9;
      // a nastavime zakazane hodnoty pro radky/sloupce/ctverce
      temp.s.radky[y] |= (1 << s.pole[i].zapsane);
      temp.s.sloupce[x] |= (1 << s.pole[i].zapsane);
      temp.s.ctverce[x/3][y/3] |= (1 << s.pole[i].zapsane);
      temp.s.doplnenych ++; // mame dalsi doplnene cislo
    }
  }
  // preneseni stavu z docasneho sudoku do puvodniho (tohoto)
  s = temp.s;
}